

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.cxx
# Opt level: O2

void __thiscall Time::add(Time *this,Estimator *object)

{
  pointer ppEVar1;
  uint i;
  uint uVar2;
  bool bVar3;
  Estimator *local_8;
  
  ppEVar1 = (this->timeEstimators).super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  bVar3 = false;
  uVar2 = 0;
  while( true ) {
    if (bVar3) {
      return;
    }
    if ((ulong)((long)(this->timeEstimators).
                      super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) <= (ulong)uVar2)
    break;
    bVar3 = ppEVar1[uVar2] == object;
    uVar2 = uVar2 + 1;
  }
  local_8 = object;
  std::vector<Estimator_*,_std::allocator<Estimator_*>_>::push_back(&this->timeEstimators,&local_8);
  return;
}

Assistant:

void Time::add( class Estimator *object )
{
	// find object in already registered objects
	bool found = false;
	for (uint i=0; !found && i<timeEstimators.size(); ++i)
		if (timeEstimators[i] == object)
			found = true;

	// add if not found
	if (!found)
		timeEstimators.push_back( object );
}